

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O0

PAL_ERROR __thiscall CorUnix::CSimpleHandleManager::Initialize(CSimpleHandleManager *this)

{
  HANDLE_TABLE_ENTRY *pHVar1;
  anon_union_8_2_a10d9252_for_u aVar2;
  uint local_18;
  PAL_ERROR local_14;
  DWORD i;
  PAL_ERROR palError;
  CSimpleHandleManager *this_local;
  
  local_14 = 0;
  InternalInitializeCriticalSection(&this->m_csLock);
  this->m_fLockInitialized = true;
  this->m_dwTableGrowthRate = 0x400;
  this->m_dwTableSize = this->m_dwTableGrowthRate;
  pHVar1 = (HANDLE_TABLE_ENTRY *)InternalMalloc((ulong)this->m_dwTableSize << 4);
  this->m_rghteHandleTable = pHVar1;
  if (this->m_rghteHandleTable == (HANDLE_TABLE_ENTRY *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    local_14 = 0xe;
  }
  else {
    for (local_18 = 0; local_18 < this->m_dwTableSize; local_18 = local_18 + 1) {
      aVar2.hiNextIndex._4_4_ = 0;
      aVar2.hiNextIndex._0_4_ = local_18 + 1;
      this->m_rghteHandleTable[local_18].u = aVar2;
      this->m_rghteHandleTable[local_18].fEntryAllocated = false;
    }
    this->m_rghteHandleTable[this->m_dwTableSize - 1].u.hiNextIndex = 0xffffffffffffffff;
    this->m_hiFreeListStart = 0;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  return local_14;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::Initialize(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;
    
    InternalInitializeCriticalSection(&m_csLock);
    m_fLockInitialized = TRUE;

    m_dwTableGrowthRate = c_BasicGrowthRate;

    /* initialize the handle table - the free list is stored in the 'object'
       field, with the head in the global 'm_hiFreeListStart'. */
    m_dwTableSize = m_dwTableGrowthRate;
    
    m_rghteHandleTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalMalloc((m_dwTableSize * sizeof(HANDLE_TABLE_ENTRY))));
    if(NULL == m_rghteHandleTable)
    {
        ERROR("Unable to create initial handle table array");
        palError = ERROR_OUTOFMEMORY;
        goto InitializeExit;
    }

    for (DWORD i = 0; i < m_dwTableSize; i++)
    {
        m_rghteHandleTable[i].u.hiNextIndex = i + 1;
        m_rghteHandleTable[i].fEntryAllocated = FALSE;
    }

    m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
    
    m_hiFreeListStart = 0;
    m_hiFreeListEnd = m_dwTableSize - 1;

    TRACE("Handle Manager initialization complete.\n");

InitializeExit:
    
    return palError;
}